

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O1

void ssh2_userauth_free(PacketProtocolLayer *ppl)

{
  strbuf *buf_o;
  long lVar1;
  PktOutQueue *pPVar2;
  
  bufchain_clear((bufchain *)(ppl + -1));
  if ((PacketProtocolLayer *)ppl[-6].selfptr != (PacketProtocolLayer *)0x0) {
    ssh_ppl_free((PacketProtocolLayer *)ppl[-6].selfptr);
  }
  if (ppl[-2].ic_process_queue.fn != (toplevel_callback_fn_t)0x0) {
    if (ppl[-2].out_pq != (PktOutQueue *)0x0) {
      lVar1 = 0;
      pPVar2 = (PktOutQueue *)0x0;
      do {
        strbuf_free(*(strbuf **)(ppl[-2].ic_process_queue.fn + lVar1));
        strbuf_free(*(strbuf **)(ppl[-2].ic_process_queue.fn + lVar1 + 8));
        pPVar2 = (PktOutQueue *)((long)&(pPVar2->pqb).end.next + 1);
        lVar1 = lVar1 + 0x20;
      } while (pPVar2 < ppl[-2].out_pq);
    }
    safefree(ppl[-2].ic_process_queue.fn);
  }
  safefree(ppl[-3].logctx);
  if (*(agent_pending_query **)&ppl[-2].remote_bugs != (agent_pending_query *)0x0) {
    agent_cancel_query(*(agent_pending_query **)&ppl[-2].remote_bugs);
  }
  filename_free((Filename *)ppl[-6].logctx);
  filename_free((Filename *)ppl[-6].seat);
  safefree(ppl[-5].vt);
  safefree(*(void **)&ppl[-4].remote_bugs);
  safefree(ppl[-6].ssh);
  safefree(*(void **)&ppl[-6].remote_bugs);
  if ((prompts_t *)ppl[-4].seat != (prompts_t *)0x0) {
    free_prompts((prompts_t *)ppl[-4].seat);
  }
  safefree(ppl[-3].selfptr);
  safefree(*(void **)&ppl[-3].ic_process_queue.queued);
  if (ppl[-3].in_pq != (PktInQueue *)0x0) {
    strbuf_free((strbuf *)ppl[-3].in_pq);
  }
  if (ppl[-3].out_pq != (PktOutQueue *)0x0) {
    strbuf_free((strbuf *)ppl[-3].out_pq);
  }
  buf_o = (strbuf *)ppl[-3].ic_process_queue.fn;
  if (buf_o != (strbuf *)0x0) {
    strbuf_free(buf_o);
  }
  strbuf_free((strbuf *)ppl[-4].selfptr);
  if ((StripCtrlChars *)ppl[-1].seat != (StripCtrlChars *)0x0) {
    stripctrl_free((StripCtrlChars *)ppl[-1].seat);
  }
  if (ppl[-1].ssh != (Ssh *)0x0) {
    stripctrl_free((StripCtrlChars *)ppl[-1].ssh);
  }
  safefree(&ppl[-6].ic_process_queue.ctx);
  return;
}

Assistant:

static void ssh2_userauth_free(PacketProtocolLayer *ppl)
{
    struct ssh2_userauth_state *s =
        container_of(ppl, struct ssh2_userauth_state, ppl);
    bufchain_clear(&s->banner);

    if (s->successor_layer)
        ssh_ppl_free(s->successor_layer);

    if (s->agent_keys) {
        for (size_t i = 0; i < s->agent_keys_len; i++) {
            strbuf_free(s->agent_keys[i].blob);
            strbuf_free(s->agent_keys[i].comment);
        }
        sfree(s->agent_keys);
    }
    sfree(s->agent_response_to_free);
    if (s->auth_agent_query)
        agent_cancel_query(s->auth_agent_query);
    filename_free(s->keyfile);
    filename_free(s->detached_cert_file);
    sfree(s->default_username);
    sfree(s->locally_allocated_username);
    sfree(s->hostname);
    sfree(s->fullhostname);
    if (s->cur_prompt)
        free_prompts(s->cur_prompt);
    sfree(s->publickey_comment);
    sfree(s->publickey_algorithm);
    if (s->publickey_blob)
        strbuf_free(s->publickey_blob);
    if (s->detached_cert_blob)
        strbuf_free(s->detached_cert_blob);
    if (s->cert_pubkey_diagnosed)
        strbuf_free(s->cert_pubkey_diagnosed);
    strbuf_free(s->last_methods_string);
    if (s->banner_scc)
        stripctrl_free(s->banner_scc);
    if (s->ki_scc)
        stripctrl_free(s->ki_scc);
    sfree(s);
}